

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbarinfo_commands.cpp
# Opt level: O0

void __thiscall
CommandDrawNumber::Parse(CommandDrawNumber *this,FScanner *sc,bool fullScreenOffsets)

{
  FScanner *pFVar1;
  bool bVar2;
  EColorRange EVar3;
  FFont *pFVar4;
  char *pcVar5;
  PClassActor *pPVar6;
  int local_78;
  int local_74;
  bool needsComma;
  FString local_38;
  int local_2c;
  FBaseCVar *pFStack_28;
  ECVarType cvartype;
  FBaseCVar *CVar;
  bool parenthesized_5;
  bool parenthesized_4;
  bool parenthesized_3;
  bool parenthesized_2;
  bool parenthesized_1;
  bool parenthesized;
  FScanner *pFStack_18;
  bool fullScreenOffsets_local;
  FScanner *sc_local;
  CommandDrawNumber *this_local;
  
  CVar._7_1_ = fullScreenOffsets;
  pFStack_18 = sc;
  sc_local = (FScanner *)this;
  FScanner::MustGetToken(sc,0x104);
  this->length = pFStack_18->Number;
  FScanner::MustGetToken(pFStack_18,0x2c);
  bVar2 = FScanner::CheckToken(pFStack_18,0x102);
  if (!bVar2) {
    FScanner::MustGetToken(pFStack_18,0x101);
  }
  pFVar4 = V_GetFont(pFStack_18->String);
  (this->super_CommandDrawString).font = pFVar4;
  if ((this->super_CommandDrawString).font == (FFont *)0x0) {
    FScanner::ScriptMessage(pFStack_18,"Unknown font \'%s\'.",pFStack_18->String);
    (this->super_CommandDrawString).font = SmallFont;
  }
  FScanner::MustGetToken(pFStack_18,0x2c);
  EVar3 = SBarInfoCommand::GetTranslation((SBarInfoCommand *)this,pFStack_18);
  this->normalTranslation = EVar3;
  FScanner::MustGetToken(pFStack_18,0x2c);
  bVar2 = FScanner::CheckToken(pFStack_18,0x104);
  if (bVar2) {
    this->value = CONSTANT;
    (this->super_CommandDrawString).valueArgument = pFStack_18->Number;
    FScanner::MustGetToken(pFStack_18,0x2c);
  }
  else {
    bVar2 = FScanner::CheckToken(pFStack_18,0x102);
    if (!bVar2) {
      FScanner::MustGetToken(pFStack_18,0x101);
    }
    this->value = INVENTORY;
    if (pFStack_18->TokenType == 0x101) {
      bVar2 = FScanner::Compare(pFStack_18,"health");
      if (bVar2) {
        this->value = HEALTH;
      }
      else {
        bVar2 = FScanner::Compare(pFStack_18,"armor");
        if (bVar2) {
          this->value = ARMOR;
        }
        else {
          bVar2 = FScanner::Compare(pFStack_18,"ammo1");
          if (bVar2) {
            this->value = AMMO1;
          }
          else {
            bVar2 = FScanner::Compare(pFStack_18,"ammo2");
            if (bVar2) {
              this->value = AMMO2;
            }
            else {
              bVar2 = FScanner::Compare(pFStack_18,"ammo1capacity");
              if (bVar2) {
                this->value = AMMO1CAPACITY;
              }
              else {
                bVar2 = FScanner::Compare(pFStack_18,"ammo2capacity");
                if (bVar2) {
                  this->value = AMMO2CAPACITY;
                }
                else {
                  bVar2 = FScanner::Compare(pFStack_18,"score");
                  if (bVar2) {
                    this->value = SCORE;
                  }
                  else {
                    bVar2 = FScanner::Compare(pFStack_18,"ammo");
                    if (bVar2) {
                      CVar._6_1_ = FScanner::CheckToken(pFStack_18,0x28);
                      this->value = AMMO;
                      if ((!(bool)CVar._6_1_) ||
                         (bVar2 = FScanner::CheckToken(pFStack_18,0x102), !bVar2)) {
                        FScanner::MustGetToken(pFStack_18,0x101);
                      }
                      pPVar6 = PClass::FindActor(pFStack_18->String);
                      this->inventoryItem = pPVar6;
                      if ((this->inventoryItem == (PClassActor *)0x0) ||
                         (bVar2 = PClass::IsAncestorOf
                                            (AAmmo::RegistrationInfo.MyClass,
                                             &this->inventoryItem->super_PClass), !bVar2)) {
                        FScanner::ScriptMessage
                                  (pFStack_18,"\'%s\' is not a type of ammo.",pFStack_18->String);
                        this->inventoryItem = (PClassActor *)AAmmo::RegistrationInfo.MyClass;
                      }
                      if ((CVar._6_1_ & 1) != 0) {
                        FScanner::MustGetToken(pFStack_18,0x29);
                      }
                    }
                    else {
                      bVar2 = FScanner::Compare(pFStack_18,"ammocapacity");
                      if (bVar2) {
                        CVar._5_1_ = FScanner::CheckToken(pFStack_18,0x28);
                        this->value = AMMOCAPACITY;
                        if ((!(bool)CVar._5_1_) ||
                           (bVar2 = FScanner::CheckToken(pFStack_18,0x102), !bVar2)) {
                          FScanner::MustGetToken(pFStack_18,0x101);
                        }
                        pPVar6 = PClass::FindActor(pFStack_18->String);
                        this->inventoryItem = pPVar6;
                        if ((this->inventoryItem == (PClassActor *)0x0) ||
                           (bVar2 = PClass::IsAncestorOf
                                              (AAmmo::RegistrationInfo.MyClass,
                                               &this->inventoryItem->super_PClass), !bVar2)) {
                          FScanner::ScriptMessage
                                    (pFStack_18,"\'%s\' is not a type of ammo.",pFStack_18->String);
                          this->inventoryItem = (PClassActor *)AAmmo::RegistrationInfo.MyClass;
                        }
                        if ((CVar._5_1_ & 1) != 0) {
                          FScanner::MustGetToken(pFStack_18,0x29);
                        }
                      }
                      else {
                        bVar2 = FScanner::Compare(pFStack_18,"frags");
                        if (bVar2) {
                          this->value = FRAGS;
                        }
                        else {
                          bVar2 = FScanner::Compare(pFStack_18,"kills");
                          if (bVar2) {
                            this->value = KILLS;
                          }
                          else {
                            bVar2 = FScanner::Compare(pFStack_18,"monsters");
                            if (bVar2) {
                              this->value = MONSTERS;
                            }
                            else {
                              bVar2 = FScanner::Compare(pFStack_18,"items");
                              if (bVar2) {
                                this->value = ITEMS;
                              }
                              else {
                                bVar2 = FScanner::Compare(pFStack_18,"totalitems");
                                if (bVar2) {
                                  this->value = TOTALITEMS;
                                }
                                else {
                                  bVar2 = FScanner::Compare(pFStack_18,"secrets");
                                  if (bVar2) {
                                    this->value = SECRETS;
                                  }
                                  else {
                                    bVar2 = FScanner::Compare(pFStack_18,"totalsecrets");
                                    if (bVar2) {
                                      this->value = TOTALSECRETS;
                                    }
                                    else {
                                      bVar2 = FScanner::Compare(pFStack_18,"armorclass");
                                      if (bVar2) {
                                        this->value = ARMORCLASS;
                                      }
                                      else {
                                        bVar2 = FScanner::Compare(pFStack_18,"savepercent");
                                        if (bVar2) {
                                          this->value = SAVEPERCENT;
                                        }
                                        else {
                                          bVar2 = FScanner::Compare(pFStack_18,"airtime");
                                          if (bVar2) {
                                            this->value = AIRTIME;
                                          }
                                          else {
                                            bVar2 = FScanner::Compare(pFStack_18,"accuracy");
                                            if (bVar2) {
                                              this->value = ACCURACY;
                                            }
                                            else {
                                              bVar2 = FScanner::Compare(pFStack_18,"stamina");
                                              if (bVar2) {
                                                this->value = STAMINA;
                                              }
                                              else {
                                                bVar2 = FScanner::Compare(pFStack_18,"keys");
                                                if (bVar2) {
                                                  this->value = KEYS;
                                                }
                                                else {
                                                  bVar2 = FScanner::Compare(pFStack_18,"globalvar");
                                                  if (bVar2) {
                                                    CVar._4_1_ = FScanner::CheckToken
                                                                           (pFStack_18,0x28);
                                                    this->value = GLOBALVAR;
                                                    FScanner::MustGetToken(pFStack_18,0x104);
                                                    if ((pFStack_18->Number < 0) ||
                                                       (0x3f < pFStack_18->Number)) {
                                                      FScanner::ScriptError
                                                                (pFStack_18,
                                                                                                                                  
                                                  "Global variable number out of range: %d",
                                                  (ulong)(uint)pFStack_18->Number);
                                                  }
                                                  (this->super_CommandDrawString).valueArgument =
                                                       pFStack_18->Number;
                                                  if ((CVar._4_1_ & 1) != 0) {
                                                    FScanner::MustGetToken(pFStack_18,0x29);
                                                  }
                                                  }
                                                  else {
                                                    bVar2 = FScanner::Compare(pFStack_18,
                                                                              "globalarray");
                                                    if (bVar2) {
                                                      CVar._3_1_ = FScanner::CheckToken
                                                                             (pFStack_18,0x28);
                                                      this->value = GLOBALARRAY;
                                                      FScanner::MustGetToken(pFStack_18,0x104);
                                                      if ((pFStack_18->Number < 0) ||
                                                         (0x3f < pFStack_18->Number)) {
                                                        FScanner::ScriptError
                                                                  (pFStack_18,
                                                                                                                                      
                                                  "Global variable number out of range: %d",
                                                  (ulong)(uint)pFStack_18->Number);
                                                  }
                                                  (this->super_CommandDrawString).valueArgument =
                                                       pFStack_18->Number;
                                                  if ((CVar._3_1_ & 1) != 0) {
                                                    FScanner::MustGetToken(pFStack_18,0x29);
                                                  }
                                                  }
                                                  else {
                                                    bVar2 = FScanner::Compare(pFStack_18,
                                                                              "poweruptime");
                                                    if (bVar2) {
                                                      CVar._2_1_ = FScanner::CheckToken
                                                                             (pFStack_18,0x28);
                                                      this->value = POWERUPTIME;
                                                      if ((!(bool)CVar._2_1_) ||
                                                         (bVar2 = FScanner::CheckToken
                                                                            (pFStack_18,0x102),
                                                         !bVar2)) {
                                                        FScanner::MustGetToken(pFStack_18,0x101);
                                                      }
                                                      pPVar6 = PClass::FindActor(pFStack_18->String)
                                                      ;
                                                      this->inventoryItem = pPVar6;
                                                      if ((this->inventoryItem == (PClassActor *)0x0
                                                          ) || (bVar2 = PClass::IsAncestorOf
                                                                                  (APowerupGiver::
                                                                                   RegistrationInfo.
                                                                                   MyClass,&this->
                                                  inventoryItem->super_PClass), !bVar2)) {
                                                    FScanner::ScriptMessage
                                                              (pFStack_18,
                                                                                                                              
                                                  "\'%s\' is not a type of PowerupGiver.",
                                                  pFStack_18->String);
                                                  this->inventoryItem =
                                                       (PClassActor *)
                                                       APowerupGiver::RegistrationInfo.MyClass;
                                                  }
                                                  if ((CVar._2_1_ & 1) != 0) {
                                                    FScanner::MustGetToken(pFStack_18,0x29);
                                                  }
                                                  }
                                                  else {
                                                    bVar2 = FScanner::Compare(pFStack_18,"intcvar");
                                                    if (bVar2) {
                                                      CVar._1_1_ = FScanner::CheckToken
                                                                             (pFStack_18,0x28);
                                                      this->value = INTCVAR;
                                                      if ((!(bool)CVar._1_1_) ||
                                                         (bVar2 = FScanner::CheckToken
                                                                            (pFStack_18,0x102),
                                                         !bVar2)) {
                                                        FScanner::MustGetToken(pFStack_18,0x101);
                                                      }
                                                      FString::operator=(&this->cvarName,
                                                                         pFStack_18->String);
                                                      pcVar5 = FString::operator_cast_to_char_
                                                                         (&this->cvarName);
                                                      pFStack_28 = FindCVar(pcVar5,(FBaseCVar **)0x0
                                                                           );
                                                      pFVar1 = pFStack_18;
                                                      if (pFStack_28 == (FBaseCVar *)0x0) {
                                                        pcVar5 = FString::GetChars(&this->cvarName);
                                                        FScanner::ScriptMessage
                                                                  (pFVar1,
                                                  "CVar \'%s\' does not exist",pcVar5);
                                                  }
                                                  else {
                                                    local_2c = (*pFStack_28->_vptr_FBaseCVar[2])();
                                                    pFVar1 = pFStack_18;
                                                    if ((local_2c != 0) && (local_2c != 1)) {
                                                      pcVar5 = FString::GetChars(&this->cvarName);
                                                      FScanner::ScriptMessage
                                                                (pFVar1,
                                                  "CVar \'%s\' is not an int or bool",pcVar5);
                                                  }
                                                  }
                                                  if ((CVar._1_1_ & 1) != 0) {
                                                    FScanner::MustGetToken(pFStack_18,0x29);
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                }
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    if (this->value == INVENTORY) {
      pPVar6 = PClass::FindActor(pFStack_18->String);
      this->inventoryItem = pPVar6;
      if ((this->inventoryItem == (PClassActor *)0x0) ||
         (bVar2 = PClass::IsAncestorOf
                            (AInventory::RegistrationInfo.MyClass,&this->inventoryItem->super_PClass
                            ), !bVar2)) {
        FScanner::ScriptMessage
                  (pFStack_18,"\'%s\' is not a type of inventory item.",pFStack_18->String);
        this->inventoryItem = (PClassActor *)AInventory::RegistrationInfo.MyClass;
      }
    }
    FScanner::MustGetToken(pFStack_18,0x2c);
  }
  while (bVar2 = FScanner::CheckToken(pFStack_18,0x101), bVar2) {
    bVar2 = FScanner::Compare(pFStack_18,"fillzeros");
    if (bVar2) {
      (this->super_CommandDrawString).field_0x5c = 1;
    }
    else {
      bVar2 = FScanner::Compare(pFStack_18,"whennotzero");
      if (bVar2) {
        (this->super_CommandDrawString).field_0x5d = 1;
      }
      else {
        bVar2 = FScanner::Compare(pFStack_18,"dontcap");
        if (bVar2) {
          (this->super_CommandDrawString).field_0x5e = 1;
        }
        else {
          bVar2 = FScanner::Compare(pFStack_18,"drawshadow");
          if (bVar2) {
            bVar2 = FScanner::CheckToken(pFStack_18,0x28);
            if (bVar2) {
              FScanner::MustGetToken(pFStack_18,0x104);
              (this->super_CommandDrawString).shadowX = pFStack_18->Number;
              FScanner::MustGetToken(pFStack_18,0x2c);
              FScanner::MustGetToken(pFStack_18,0x104);
              (this->super_CommandDrawString).shadowY = pFStack_18->Number;
              FScanner::MustGetToken(pFStack_18,0x29);
            }
            (this->super_CommandDrawString).shadow = true;
          }
          else {
            bVar2 = FScanner::Compare(pFStack_18,"interpolate");
            if (bVar2) {
              FScanner::MustGetToken(pFStack_18,0x28);
              FScanner::MustGetToken(pFStack_18,0x104);
              this->interpolationSpeed = pFStack_18->Number;
              FScanner::MustGetToken(pFStack_18,0x29);
            }
            else {
              bVar2 = FScanner::Compare(pFStack_18,"alignment");
              if (bVar2) {
                FScanner::MustGetToken(pFStack_18,0x28);
                FScanner::MustGetToken(pFStack_18,0x101);
                bVar2 = FScanner::Compare(pFStack_18,"right");
                if (bVar2) {
                  (this->super_CommandDrawString).alignment = ALIGN_RIGHT;
                }
                else {
                  bVar2 = FScanner::Compare(pFStack_18,"left");
                  if (bVar2) {
                    (this->super_CommandDrawString).alignment = ALIGN_LEFT;
                  }
                  else {
                    bVar2 = FScanner::Compare(pFStack_18,"center");
                    if (bVar2) {
                      (this->super_CommandDrawString).alignment = ALIGN_CENTER;
                    }
                    else {
                      FScanner::ScriptError
                                (pFStack_18,"Unknown alignment \'%s\'.",pFStack_18->String);
                    }
                  }
                }
                FScanner::MustGetToken(pFStack_18,0x29);
              }
              else {
                bVar2 = FScanner::Compare(pFStack_18,"prefix");
                if (bVar2) {
                  (this->super_CommandDrawString).field_0x5f = 1;
                  FScanner::MustGetToken(pFStack_18,0x28);
                  CommandDrawString::ParseStringValue(&this->super_CommandDrawString,pFStack_18);
                  FScanner::MustGetToken(pFStack_18,0x2c);
                  FScanner::MustGetToken(pFStack_18,0x102);
                  FString::operator=(&this->prefixPadding,pFStack_18->String);
                  if ((this->super_CommandDrawString).strValue == CONSTANT) {
                    (this->super_CommandDrawString).field_0x5f = 0;
                    FString::operator+(&local_38,&(this->super_CommandDrawString).str);
                    FString::operator=(&this->prefixPadding,&local_38);
                    FString::~FString(&local_38);
                  }
                  FScanner::MustGetToken(pFStack_18,0x29);
                }
                else {
                  FScanner::ScriptError(pFStack_18,"Unknown flag \'%s\'.",pFStack_18->String);
                }
              }
            }
          }
        }
      }
    }
    bVar2 = FScanner::CheckToken(pFStack_18,0x7c);
    if (!bVar2) {
      FScanner::MustGetToken(pFStack_18,0x2c);
    }
  }
  SBarInfoCommand::GetCoordinates
            ((SBarInfoCommand *)this,pFStack_18,(bool)(CVar._7_1_ & 1),
             &(this->super_CommandDrawString).startX,&(this->super_CommandDrawString).y);
  bVar2 = FScanner::CheckToken(pFStack_18,0x2c);
  if (bVar2) {
    bVar2 = FScanner::CheckToken(pFStack_18,0x104);
    if (bVar2) {
      (this->super_CommandDrawString).spacing = pFStack_18->Number;
      bVar2 = FScanner::CheckToken(pFStack_18,0x2c);
      if (!bVar2) goto LAB_006c06ca;
    }
    EVar3 = SBarInfoCommand::GetTranslation((SBarInfoCommand *)this,pFStack_18);
    this->lowTranslation = EVar3;
    FScanner::MustGetToken(pFStack_18,0x2c);
    FScanner::MustGetToken(pFStack_18,0x104);
    this->lowValue = pFStack_18->Number;
    bVar2 = FScanner::CheckToken(pFStack_18,0x2c);
    if (bVar2) {
      EVar3 = SBarInfoCommand::GetTranslation((SBarInfoCommand *)this,pFStack_18);
      this->highTranslation = EVar3;
      FScanner::MustGetToken(pFStack_18,0x2c);
      FScanner::MustGetToken(pFStack_18,0x104);
      this->highValue = pFStack_18->Number;
    }
  }
LAB_006c06ca:
  FScanner::MustGetToken(pFStack_18,0x3b);
  if (this->value == HEALTH) {
    if ((((this->super_CommandDrawString).super_SBarInfoCommand.script)->interpolateHealth & 1U) ==
        0) {
      local_74 = this->interpolationSpeed;
    }
    else {
      local_74 = ((this->super_CommandDrawString).super_SBarInfoCommand.script)->interpolationSpeed;
    }
    this->interpolationSpeed = local_74;
  }
  else if (this->value == ARMOR) {
    if ((((this->super_CommandDrawString).super_SBarInfoCommand.script)->interpolateArmor & 1U) == 0
       ) {
      local_78 = this->interpolationSpeed;
    }
    else {
      local_78 = ((this->super_CommandDrawString).super_SBarInfoCommand.script)->
                 armorInterpolationSpeed;
    }
    this->interpolationSpeed = local_78;
  }
  return;
}

Assistant:

void	Parse(FScanner &sc, bool fullScreenOffsets)
		{
			sc.MustGetToken(TK_IntConst);
			length = sc.Number;
			sc.MustGetToken(',');
			if(!sc.CheckToken(TK_StringConst))
				sc.MustGetToken(TK_Identifier);
			font = V_GetFont(sc.String);
			if(font == NULL)
			{
				sc.ScriptMessage("Unknown font '%s'.", sc.String);
				font = SmallFont;
			}
			sc.MustGetToken(',');
			normalTranslation = GetTranslation(sc);
			sc.MustGetToken(',');
			if(sc.CheckToken(TK_IntConst))
			{
				value = CONSTANT;
				valueArgument = sc.Number;
				sc.MustGetToken(',');
			}
			else
			{
				if(!sc.CheckToken(TK_StringConst))
					sc.MustGetToken(TK_Identifier);
				value = INVENTORY;
				if(sc.TokenType == TK_Identifier)
				{
					if(sc.Compare("health"))
						value = HEALTH;
					else if(sc.Compare("armor"))
						value = ARMOR;
					else if(sc.Compare("ammo1"))
						value = AMMO1;
					else if(sc.Compare("ammo2"))
						value = AMMO2;
					else if(sc.Compare("ammo1capacity"))
						value = AMMO1CAPACITY;
					else if(sc.Compare("ammo2capacity"))
						value = AMMO2CAPACITY;
					else if(sc.Compare("score"))
						value = SCORE;
					else if(sc.Compare("ammo")) //request the next string to be an ammo type
					{
						bool parenthesized = sc.CheckToken('(');

						value = AMMO;
						if(!parenthesized || !sc.CheckToken(TK_StringConst))
							sc.MustGetToken(TK_Identifier);
						inventoryItem = PClass::FindActor(sc.String);
						if(inventoryItem == NULL || !RUNTIME_CLASS(AAmmo)->IsAncestorOf(inventoryItem)) //must be a kind of ammo
						{
							sc.ScriptMessage("'%s' is not a type of ammo.", sc.String);
							inventoryItem = RUNTIME_CLASS(AAmmo);
						}

						if(parenthesized) sc.MustGetToken(')');
					}
					else if(sc.Compare("ammocapacity"))
					{
						bool parenthesized = sc.CheckToken('(');

						value = AMMOCAPACITY;
						if(!parenthesized || !sc.CheckToken(TK_StringConst))
							sc.MustGetToken(TK_Identifier);
						inventoryItem = PClass::FindActor(sc.String);
						if(inventoryItem == NULL || !RUNTIME_CLASS(AAmmo)->IsAncestorOf(inventoryItem)) //must be a kind of ammo
						{
							sc.ScriptMessage("'%s' is not a type of ammo.", sc.String);
							inventoryItem = RUNTIME_CLASS(AAmmo);
						}

						if(parenthesized) sc.MustGetToken(')');
					}
					else if(sc.Compare("frags"))
						value = FRAGS;
					else if(sc.Compare("kills"))
						value = KILLS;
					else if(sc.Compare("monsters"))
						value = MONSTERS;
					else if(sc.Compare("items"))
						value = ITEMS;
					else if(sc.Compare("totalitems"))
						value = TOTALITEMS;
					else if(sc.Compare("secrets"))
						value = SECRETS;
					else if(sc.Compare("totalsecrets"))
						value = TOTALSECRETS;
					else if(sc.Compare("armorclass"))
						value = ARMORCLASS;
					else if(sc.Compare("savepercent"))
						value = SAVEPERCENT;
					else if(sc.Compare("airtime"))
						value = AIRTIME;
					else if(sc.Compare("accuracy"))
						value = ACCURACY;
					else if(sc.Compare("stamina"))
						value = STAMINA;
					else if(sc.Compare("keys"))
						value = KEYS;
					else if(sc.Compare("globalvar"))
					{
						bool parenthesized = sc.CheckToken('(');

						value = GLOBALVAR;
						sc.MustGetToken(TK_IntConst);
						if(sc.Number < 0 || sc.Number >= NUM_GLOBALVARS)
							sc.ScriptError("Global variable number out of range: %d", sc.Number);
						valueArgument = sc.Number;

						if(parenthesized) sc.MustGetToken(')');
					}
					else if(sc.Compare("globalarray")) //acts like variable[playernumber()]
					{
						bool parenthesized = sc.CheckToken('(');

						value = GLOBALARRAY;
						sc.MustGetToken(TK_IntConst);
						if(sc.Number < 0 || sc.Number >= NUM_GLOBALVARS)
							sc.ScriptError("Global variable number out of range: %d", sc.Number);
						valueArgument = sc.Number;

						if(parenthesized) sc.MustGetToken(')');
					}
					else if(sc.Compare("poweruptime"))
					{
						bool parenthesized = sc.CheckToken('(');

						value = POWERUPTIME;
						if(!parenthesized || !sc.CheckToken(TK_StringConst))
							sc.MustGetToken(TK_Identifier);
						inventoryItem = PClass::FindActor(sc.String);
						if(inventoryItem == NULL || !RUNTIME_CLASS(APowerupGiver)->IsAncestorOf(inventoryItem))
						{
							sc.ScriptMessage("'%s' is not a type of PowerupGiver.", sc.String);
							inventoryItem = RUNTIME_CLASS(APowerupGiver);
						}

						if(parenthesized) sc.MustGetToken(')');
					}
					else if (sc.Compare("intcvar"))
					{
						bool parenthesized = sc.CheckToken('(');

						value = INTCVAR;

						if (!parenthesized || !sc.CheckToken(TK_StringConst))
							sc.MustGetToken(TK_Identifier);
						
						cvarName = sc.String;

						// We have a name, but make sure it exists. If not, send notification so modders
						// are aware of the situation.
						FBaseCVar *CVar = FindCVar(cvarName, nullptr);

						if (CVar != nullptr)
						{
							ECVarType cvartype = CVar->GetRealType();

							if (!(cvartype == CVAR_Bool || cvartype == CVAR_Int))
							{
								sc.ScriptMessage("CVar '%s' is not an int or bool", cvarName.GetChars());
							}
						}
						else
						{
							sc.ScriptMessage("CVar '%s' does not exist", cvarName.GetChars());
						}
						
						if (parenthesized) sc.MustGetToken(')');
					}
				}
				if(value == INVENTORY)
				{
					inventoryItem = PClass::FindActor(sc.String);
					if(inventoryItem == NULL || !RUNTIME_CLASS(AInventory)->IsAncestorOf(inventoryItem)) //must be a kind of ammo
					{
						sc.ScriptMessage("'%s' is not a type of inventory item.", sc.String);
						inventoryItem = RUNTIME_CLASS(AInventory);
					}
				}
				sc.MustGetToken(',');
			}
			while(sc.CheckToken(TK_Identifier))
			{
				if(sc.Compare("fillzeros"))
					fillZeros = true;
				else if(sc.Compare("whennotzero"))
					whenNotZero = true;
				else if(sc.Compare("dontcap"))
					dontCap = true;
				else if(sc.Compare("drawshadow"))
				{
					if(sc.CheckToken('('))
					{
						sc.MustGetToken(TK_IntConst);
						shadowX = sc.Number;
						sc.MustGetToken(',');
						sc.MustGetToken(TK_IntConst);
						shadowY = sc.Number;
						sc.MustGetToken(')');
					}
					shadow = true;
				}
				else if(sc.Compare("interpolate"))
				{
					sc.MustGetToken('(');
					sc.MustGetToken(TK_IntConst);
					interpolationSpeed = sc.Number;
					sc.MustGetToken(')');
				}
				else if(sc.Compare("alignment"))
				{
					sc.MustGetToken('(');
					sc.MustGetToken(TK_Identifier);
					if(sc.Compare("right"))
						alignment = ALIGN_RIGHT;
					else if(sc.Compare("left"))
						alignment = ALIGN_LEFT;
					else if(sc.Compare("center"))
						alignment = ALIGN_CENTER;
					else
						sc.ScriptError("Unknown alignment '%s'.", sc.String);
					sc.MustGetToken(')');
				}
				else if(sc.Compare("prefix"))
				{
					usePrefix = true;
					sc.MustGetToken('(');
					ParseStringValue(sc);
					sc.MustGetToken(',');
					sc.MustGetToken(TK_StringConst);
					prefixPadding = sc.String;
					if(strValue == CommandDrawString::CONSTANT)
					{
						usePrefix = false; // Use prefix just determines if we tick the string.
						prefixPadding = str + prefixPadding;
					}
					sc.MustGetToken(')');
				}
				else
					sc.ScriptError("Unknown flag '%s'.", sc.String);
				if(!sc.CheckToken('|'))
					sc.MustGetToken(',');
			}
			GetCoordinates(sc, fullScreenOffsets, startX, y);
			if(sc.CheckToken(','))
			{
				bool needsComma = false;
				if(sc.CheckToken(TK_IntConst)) //font spacing
				{
					spacing = sc.Number;
					needsComma = true;
				}
				if(!needsComma || sc.CheckToken(',')) //2nd coloring for "low-on" value
				{
					lowTranslation = GetTranslation(sc);
					sc.MustGetToken(',');
					sc.MustGetToken(TK_IntConst);
					lowValue = sc.Number;
					if(sc.CheckToken(',')) //3rd coloring for "high-on" value
					{
						highTranslation = GetTranslation(sc);
						sc.MustGetToken(',');
						sc.MustGetToken(TK_IntConst);
						highValue = sc.Number;
					}
				}
			}
			sc.MustGetToken(';');

			if(value == HEALTH)
				interpolationSpeed = script->interpolateHealth ? script->interpolationSpeed : interpolationSpeed;
			else if(value == ARMOR)
				interpolationSpeed = script->interpolateArmor ? script->armorInterpolationSpeed : interpolationSpeed;
		}